

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O0

void build_impute_node<InputData<double,unsigned_long>&,WorkerMemory<ImputedData<unsigned_long,double>,double,double>&,double>
               (ImputeNode *imputer,
               WorkerMemory<ImputedData<unsigned_long,_double>,_double,_double> *workspace,
               InputData<double,_unsigned_long> *input_data,ModelParams *model_params,
               vector<ImputeNode,_std::allocator<ImputeNode>_> *imputer_tree,size_t curr_depth,
               size_t min_imp_obs)

{
  double dVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  uint uVar3;
  size_type sVar4;
  size_type sVar5;
  long lVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  double *pdVar10;
  unsigned_long *puVar11;
  reference pvVar12;
  reference pdVar13;
  long in_RCX;
  long *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *in_R8;
  long in_R9;
  bool bVar14;
  undefined4 uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 in_stack_00000008;
  int cat_2;
  size_t col_9;
  size_t col_8;
  double *w_7;
  iterator __end3_7;
  iterator __begin3_7;
  vector<double,_std::allocator<double>_> *__range3_7;
  double *w_6;
  iterator __end3_6;
  iterator __begin3_6;
  vector<double,_std::allocator<double>_> *__range3_6;
  double *w_5;
  iterator __end3_5;
  iterator __begin3_5;
  vector<double,_std::allocator<double>_> *__range3_5;
  double *w_4;
  iterator __end3_4;
  iterator __begin3_4;
  vector<double,_std::allocator<double>_> *__range3_4;
  double curr_depth_dbl;
  double *w_3;
  iterator __end3_3;
  iterator __begin3_3;
  vector<double,_std::allocator<double>_> *__range3_3;
  double *w_2;
  iterator __end3_2;
  iterator __begin3_2;
  vector<double,_std::allocator<double>_> *__range3_2;
  double *w_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<double,_std::allocator<double>_> *__range3_1;
  double *w;
  iterator __end3;
  iterator __begin3;
  vector<double,_std::allocator<double>_> *__range3;
  double wsum_div;
  int cat_1;
  double *cat;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  size_t col_7;
  size_t col_6;
  double min_imp_obs_dbl;
  size_t curr_tree;
  size_t look_aboves;
  size_t *row_4;
  size_t col_5;
  size_t curr_pos;
  size_t ind_end_col;
  size_t end_col;
  size_t st_col;
  size_t *ix_arr;
  size_t col_4;
  size_t row_3;
  size_t row_2;
  size_t col_3;
  double diff;
  double val;
  double corr;
  double prod_sum;
  size_t row_1;
  size_t col_2;
  size_t row;
  size_t col_1;
  size_t cnt;
  size_t ix;
  double weight;
  int xcat;
  double xnum;
  size_t col;
  bool has_weights;
  double wsum;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc58;
  value_type vVar25;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffc70;
  unsigned_long *in_stack_fffffffffffffc78;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc80;
  size_type in_stack_fffffffffffffc88;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc90;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_fffffffffffffcb0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcb8;
  size_t in_stack_fffffffffffffcc0;
  size_t in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffcd8;
  value_type vVar26;
  bool local_2b5;
  int local_2b4;
  ulong local_2b0;
  ulong local_2a8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_290;
  vector<double,_std::allocator<double>_> *local_288;
  reference local_280;
  double *local_278;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_270;
  vector<double,_std::allocator<double>_> *local_268;
  reference local_260;
  double *local_258;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_250;
  vector<double,_std::allocator<double>_> *local_248;
  reference local_240;
  double *local_238;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_230;
  vector<double,_std::allocator<double>_> *local_228;
  double local_220;
  reference local_218;
  double *local_210;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_208;
  vector<double,_std::allocator<double>_> *local_200;
  reference local_1f8;
  double *local_1f0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1e8;
  vector<double,_std::allocator<double>_> *local_1e0;
  reference local_1d8;
  double *local_1d0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1c8;
  vector<double,_std::allocator<double>_> *local_1c0;
  reference local_1b8;
  double *local_1b0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1a8;
  vector<double,_std::allocator<double>_> *local_1a0;
  double local_198;
  double *local_190;
  double *local_188;
  int local_17c;
  double *local_178;
  double *local_170;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_168;
  reference local_160;
  ulong local_158;
  ulong local_150;
  double local_148;
  pointer local_140;
  long local_138;
  ulong *local_130;
  ulong local_128;
  double *local_120;
  double *local_118;
  long local_110;
  ulong local_108;
  long local_100;
  long local_f8;
  unsigned_long *local_f0;
  ulong local_e8;
  pointer local_e0;
  pointer local_d8;
  ulong local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  pointer local_a8;
  ulong local_a0;
  pointer local_98;
  ulong local_90;
  long local_88;
  size_type local_80;
  value_type local_78;
  int local_6c;
  double local_68;
  ulong local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  bool local_39;
  double local_38;
  long local_30;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *local_28;
  long local_20;
  long *local_18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  vector<double,_std::allocator<double>_> *local_8;
  undefined1 auVar18 [16];
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar4 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)
                     &in_RSI[8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_2b5 = true;
  if (sVar4 == 0) {
    sVar5 = tsl::
            robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
            ::size((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                    *)0x3d59c9);
    local_2b5 = sVar5 != 0;
  }
  local_39 = local_2b5;
  if (local_2b5 == false) {
    lVar6 = (long)local_10[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start +
            (1 - (long)local_10[3].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    auVar17._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar17._0_8_ = lVar6;
    auVar17._12_4_ = 0x45300000;
    local_38 = (auVar17._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
  }
  else {
    local_38 = calculate_sum_weights<double>
                         (in_stack_fffffffffffffcd8,
                          CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                          in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                          in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  }
  local_48 = 0;
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             (value_type_conflict *)in_stack_fffffffffffffc80);
  local_50 = 0;
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             (value_type_conflict *)in_stack_fffffffffffffc80);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
  local_58 = 0;
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             (value_type_conflict *)in_stack_fffffffffffffc80);
  std::vector<double,_std::allocator<double>_>::shrink_to_fit
            ((vector<double,_std::allocator<double>_> *)0x3d5b46);
  std::vector<double,_std::allocator<double>_>::shrink_to_fit
            ((vector<double,_std::allocator<double>_> *)0x3d5b57);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::shrink_to_fit((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)0x3d5b68);
  std::vector<double,_std::allocator<double>_>::shrink_to_fit
            ((vector<double,_std::allocator<double>_> *)0x3d5b79);
  for (local_60 = 0; local_60 < (ulong)local_18[5]; local_60 = local_60 + 1) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(local_8 + 2),local_60);
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(local_8 + 2),local_60);
    std::vector<double,_std::allocator<double>_>::shrink_to_fit
              ((vector<double,_std::allocator<double>_> *)0x3d5bf5);
  }
  if (((local_18[0xd] == 0) && (local_18[1] != 0)) || (local_18[5] != 0)) {
    if ((local_39 & 1U) == 0) {
      if (*local_18 != 0) {
        for (local_90 = 0; local_90 < (ulong)local_18[1]; local_90 = local_90 + 1) {
          local_88 = 0;
          for (local_98 = local_10[3].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
              local_98 <=
              local_10[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start; local_98 = (pointer)((long)local_98 + 1)) {
            lVar6 = *local_18;
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (local_10,(size_type)local_98);
            local_68 = *(double *)(lVar6 + (*pvVar7 + local_90 * local_18[6]) * 8);
            uVar3 = std::isnan(local_68);
            if (((uVar3 & 1) == 0) &&
               (uVar3 = std::isinf(local_68), dVar16 = local_68, (uVar3 & 1) == 0)) {
              local_88 = local_88 + 1;
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8,local_90);
              dVar1 = *pvVar8;
              auVar22._8_4_ = (int)((ulong)local_88 >> 0x20);
              auVar22._0_8_ = local_88;
              auVar22._12_4_ = 0x45300000;
              uVar15 = (undefined4)local_88;
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8,local_90);
              *pvVar8 = (dVar16 - dVar1) /
                        ((auVar22._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,uVar15) - 4503599627370496.0)) + *pvVar8;
            }
          }
          auVar18._8_4_ = (int)((ulong)local_88 >> 0x20);
          auVar18._0_8_ = local_88;
          auVar18._12_4_ = 0x45300000;
          uVar15 = (undefined4)local_88;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8 + 1,local_90);
          *pvVar8 = (auVar18._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,uVar15) - 4503599627370496.0);
        }
      }
      if (local_18[2] != 0) {
        for (local_a0 = 0; local_a0 < (ulong)local_18[5]; local_a0 = local_a0 + 1) {
          local_88 = 0;
          for (local_a8 = local_10[3].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
              local_a8 <=
              local_10[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start; local_a8 = (pointer)((long)local_a8 + 1)) {
            lVar6 = local_18[2];
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (local_10,(size_type)local_a8);
            local_6c = *(int *)(lVar6 + (*pvVar7 + local_a0 * local_18[6]) * 4);
            if (-1 < local_6c) {
              local_88 = local_88 + 1;
              pvVar9 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     *)(local_8 + 2),local_a0);
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar9,(long)local_6c);
              *pvVar8 = *pvVar8 + 1.0;
            }
          }
          auVar19._8_4_ = (int)((ulong)local_88 >> 0x20);
          auVar19._0_8_ = local_88;
          auVar19._12_4_ = 0x45300000;
          uVar15 = (undefined4)local_88;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8 + 3,local_a0);
          *pvVar8 = (auVar19._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,uVar15) - 4503599627370496.0);
        }
      }
    }
    else {
      if (*local_18 != 0) {
        for (local_d0 = 0; local_d0 < (ulong)local_18[1]; local_d0 = local_d0 + 1) {
          local_b0 = 0.0;
          local_b8 = 0.0;
          for (local_d8 = local_10[3].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage; dVar16 = local_b0,
              local_d8 <=
              local_10[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start; local_d8 = (pointer)((long)local_d8 + 1)) {
            lVar6 = *local_18;
            pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (local_10,(size_type)local_d8);
            local_68 = *(double *)(lVar6 + (*pvVar7 + local_d0 * local_18[6]) * 8);
            uVar3 = std::isnan(local_68);
            if (((uVar3 & 1) == 0) && (uVar3 = std::isinf(local_68), (uVar3 & 1) == 0)) {
              sVar4 = std::vector<double,_std::allocator<double>_>::size
                                ((vector<double,_std::allocator<double>_> *)
                                 &local_10[8].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
              if (sVar4 == 0) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (local_10,(size_type)local_d8);
                pdVar10 = tsl::
                          robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                          ::operator[](in_stack_fffffffffffffc60,
                                       (unsigned_long *)in_stack_fffffffffffffc58);
                local_78 = *pdVar10;
              }
              else {
                pvVar2 = local_10 + 8;
                pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (local_10,(size_type)local_d8);
                pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)
                                    &(pvVar2->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage,*pvVar7);
                local_78 = *pvVar8;
              }
              vVar25 = local_78;
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (local_8 + 1,local_d0);
              *pvVar8 = vVar25 + *pvVar8;
              local_c0 = local_68 * local_78 + -local_b8;
              local_c8 = local_b0 + local_c0;
              local_b8 = (local_c8 - local_b0) - local_c0;
              local_b0 = local_c8;
            }
          }
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8 + 1,local_d0);
          dVar1 = *pvVar8;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8,local_d0);
          *pvVar8 = dVar16 / dVar1;
        }
      }
      if (local_18[5] != 0) {
        for (local_e0 = local_10[3].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
            local_e0 <=
            local_10[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start; local_e0 = (pointer)((long)local_e0 + 1)) {
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (local_10,(size_type)local_e0);
          local_80 = *pvVar7;
          sVar4 = std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)
                             &local_10[8].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (sVar4 == 0) {
            pdVar10 = tsl::
                      robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                      ::operator[](in_stack_fffffffffffffc60,
                                   (unsigned_long *)in_stack_fffffffffffffc58);
            local_78 = *pdVar10;
          }
          else {
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)
                                &local_10[8].
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,local_80);
            local_78 = *pvVar8;
          }
          for (local_e8 = 0; local_e8 < (ulong)local_18[5]; local_e8 = local_e8 + 1) {
            local_6c = *(int *)(local_18[2] + (local_80 + local_e8 * local_18[6]) * 4);
            if (-1 < local_6c) {
              vVar26 = local_78;
              pvVar9 = std::
                       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     *)(local_8 + 2),local_e8);
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar9,(long)local_6c);
              vVar25 = local_78;
              *pvVar8 = vVar26 + *pvVar8;
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (local_8 + 3,local_e8);
              *pvVar8 = vVar25 + *pvVar8;
            }
          }
        }
      }
    }
  }
  if (local_18[0xd] != 0) {
    local_f0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3d6570);
    local_118 = (double *)
                std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffc58);
    local_120 = (double *)
                std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffc58);
    __last._M_current._4_4_ = in_stack_fffffffffffffc6c;
    __last._M_current._0_4_ = in_stack_fffffffffffffc68;
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (in_stack_fffffffffffffc70,__last,(double *)in_stack_fffffffffffffc60);
    for (local_128 = 0; local_128 < (ulong)local_18[1]; local_128 = local_128 + 1) {
      local_110 = *(long *)(local_18[0xd] + local_128 * 8);
      local_100 = *(long *)(local_18[0xd] + 8 + local_128 * 8) + -1;
      local_108 = *(ulong *)(local_18[0xc] + local_100 * 8);
      local_f8 = local_110;
      local_130 = std::lower_bound<unsigned_long*,unsigned_long>
                            ((unsigned_long *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                             (unsigned_long *)in_stack_fffffffffffffc70._M_current);
      while( true ) {
        bVar14 = false;
        if ((local_130 !=
             local_f0 +
             (long)local_10[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start + 1) &&
           (bVar14 = false, local_110 != local_100 + 1)) {
          bVar14 = *local_130 <= local_108;
        }
        if (!bVar14) break;
        if (*(ulong *)(local_18[0xc] + local_110 * 8) == *local_130) {
          local_68 = *(double *)(local_18[0xb] + local_110 * 8);
          sVar4 = std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)
                             &local_10[8].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (sVar4 == 0) {
            sVar5 = tsl::
                    robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                    ::size((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                            *)0x3d67e3);
            if (sVar5 == 0) {
              local_78 = 1.0;
            }
            else {
              pdVar10 = tsl::
                        robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                        ::operator[](in_stack_fffffffffffffc60,
                                     (unsigned_long *)in_stack_fffffffffffffc58);
              local_78 = *pdVar10;
            }
          }
          else {
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)
                                &local_10[8].
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,*local_130);
            local_78 = *pvVar8;
          }
          uVar3 = std::isnan(local_68);
          if (((uVar3 & 1) == 0) && (uVar3 = std::isinf(local_68), (uVar3 & 1) == 0)) {
            vVar25 = local_78;
            dVar16 = local_68;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8,local_128);
            *pvVar8 = vVar25 * dVar16 + *pvVar8;
          }
          else {
            vVar25 = local_78;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8 + 1,local_128)
            ;
            *pvVar8 = *pvVar8 - vVar25;
          }
          if ((local_130 ==
               local_f0 +
               (long)local_10[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start) || (local_110 == local_100)) break;
          local_130 = local_130 + 1;
          puVar11 = std::lower_bound<unsigned_long*,unsigned_long>
                              ((unsigned_long *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                               (unsigned_long *)in_stack_fffffffffffffc70._M_current);
          local_110 = (long)puVar11 - local_18[0xc] >> 3;
        }
        else if (*local_130 < *(ulong *)(local_18[0xc] + local_110 * 8)) {
          local_130 = std::lower_bound<unsigned_long*,unsigned_long>
                                ((unsigned_long *)in_stack_fffffffffffffc80,
                                 in_stack_fffffffffffffc78,
                                 (unsigned_long *)in_stack_fffffffffffffc70._M_current);
        }
        else {
          puVar11 = std::lower_bound<unsigned_long*,unsigned_long>
                              ((unsigned_long *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                               (unsigned_long *)in_stack_fffffffffffffc70._M_current);
          local_110 = (long)puVar11 - local_18[0xc] >> 3;
        }
      }
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8 + 1,local_128);
      vVar25 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8,local_128);
      *pvVar8 = *pvVar8 / vVar25;
    }
  }
  auVar20._8_4_ = (int)((ulong)in_stack_00000008 >> 0x20);
  auVar20._0_8_ = in_stack_00000008;
  auVar20._12_4_ = 0x45300000;
  local_148 = (auVar20._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)in_stack_00000008) - 4503599627370496.0);
  sVar4 = std::vector<double,_std::allocator<double>_>::size(local_8);
  if (sVar4 != 0) {
    for (local_150 = 0; local_150 < (ulong)local_18[1]; local_150 = local_150 + 1) {
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8 + 1,local_150);
      if (*pvVar8 < local_148) {
        local_138 = 1;
        local_140 = local_8[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
        while( true ) {
          pvVar12 = std::vector<ImputeNode,_std::allocator<ImputeNode>_>::operator[]
                              (local_28,(size_type)local_140);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pvVar12->num_sum,local_150);
          uVar3 = std::isnan(*pvVar8);
          if ((uVar3 & 1) == 0) {
            pvVar12 = std::vector<ImputeNode,_std::allocator<ImputeNode>_>::operator[]
                                (local_28,(size_type)local_140);
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&pvVar12->num_sum,local_150);
            uVar3 = std::isinf(*pvVar8);
            if ((uVar3 & 1) == 0) {
              pvVar12 = std::vector<ImputeNode,_std::allocator<ImputeNode>_>::operator[]
                                  (local_28,(size_type)local_140);
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&pvVar12->num_sum,local_150);
              dVar16 = *pvVar8;
              pvVar12 = std::vector<ImputeNode,_std::allocator<ImputeNode>_>::operator[]
                                  (local_28,(size_type)local_140);
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (&pvVar12->num_weight,local_150);
              dVar1 = *pvVar8;
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8,local_150);
              *pvVar8 = dVar16 / dVar1;
              lVar6 = local_138 * 2;
              auVar23._8_4_ = (int)((ulong)lVar6 >> 0x20);
              auVar23._0_8_ = lVar6;
              auVar23._12_4_ = 0x45300000;
              dVar16 = local_38 /
                       ((auVar23._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
              pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (local_8 + 1,local_150);
              *pvVar8 = dVar16;
              goto LAB_003d6d87;
            }
          }
          if (local_140 == (pointer)0x0) break;
          pvVar12 = std::vector<ImputeNode,_std::allocator<ImputeNode>_>::operator[]
                              (local_28,(size_type)local_140);
          local_140 = (pointer)pvVar12->parent;
          local_138 = local_138 + 1;
        }
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8,local_150);
        *pvVar8 = NAN;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8 + 1,local_150);
        *pvVar8 = 0.0;
      }
LAB_003d6d87:
    }
  }
  sVar4 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(local_8 + 2));
  if (sVar4 != 0) {
    for (local_158 = 0; local_158 < (ulong)local_18[5]; local_158 = local_158 + 1) {
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8 + 3,local_158);
      if (*pvVar8 < local_148) {
        local_138 = 1;
        local_140 = local_8[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
        while( true ) {
          pvVar12 = std::vector<ImputeNode,_std::allocator<ImputeNode>_>::operator[]
                              (local_28,(size_type)local_140);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pvVar12->cat_weight,local_158);
          if (0.0 < *pvVar8) break;
          if (local_140 == (pointer)0x0) goto LAB_003d713b;
          pvVar12 = std::vector<ImputeNode,_std::allocator<ImputeNode>_>::operator[]
                              (local_28,(size_type)local_140);
          local_140 = (pointer)pvVar12->parent;
          local_138 = local_138 + 1;
        }
        for (local_17c = 0; local_17c < *(int *)(local_18[3] + local_158 * 4);
            local_17c = local_17c + 1) {
          pvVar12 = std::vector<ImputeNode,_std::allocator<ImputeNode>_>::operator[]
                              (local_28,(size_type)local_140);
          pvVar9 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&pvVar12->cat_sum,local_158);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar9,(long)local_17c);
          if (*pvVar8 <= 0.0) {
            dVar16 = 0.0;
          }
          else {
            pvVar12 = std::vector<ImputeNode,_std::allocator<ImputeNode>_>::operator[]
                                (local_28,(size_type)local_140);
            pvVar9 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](&pvVar12->cat_sum,local_158);
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar9,(long)local_17c);
            vVar25 = *pvVar8;
            pvVar12 = std::vector<ImputeNode,_std::allocator<ImputeNode>_>::operator[]
                                (local_28,(size_type)local_140);
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&pvVar12->cat_weight,local_158);
            dVar16 = vVar25 / *pvVar8;
          }
          pvVar9 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)(local_8 + 2),local_158);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar9,(long)local_17c);
          *pvVar8 = *pvVar8 + dVar16;
          lVar6 = local_138 * 2;
          auVar24._8_4_ = (int)((ulong)lVar6 >> 0x20);
          auVar24._0_8_ = lVar6;
          auVar24._12_4_ = 0x45300000;
          dVar16 = local_38 /
                   ((auVar24._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8 + 3,local_158);
          *pvVar8 = dVar16;
        }
LAB_003d713b:
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)(local_8 + 2),local_158);
        local_188 = (double *)
                    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffc58);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)(local_8 + 2),local_158);
        local_190 = (double *)
                    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffc58);
        __last_00._M_current._4_4_ = in_stack_fffffffffffffc6c;
        __last_00._M_current._0_4_ = in_stack_fffffffffffffc68;
        in_stack_fffffffffffffc70._M_current =
             (double *)
             std::
             accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                       (in_stack_fffffffffffffc70,__last_00,(double)in_stack_fffffffffffffc60);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8 + 3,local_158);
        *pvVar8 = (value_type)in_stack_fffffffffffffc70._M_current;
      }
      else {
        local_160 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  *)(local_8 + 2),local_158);
        local_168._M_current =
             (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffc58);
        local_170 = (double *)
                    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffc58);
        while (bVar14 = __gnu_cxx::operator!=
                                  ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                    *)in_stack_fffffffffffffc60,
                                   (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                    *)in_stack_fffffffffffffc58), bVar14) {
          local_178 = __gnu_cxx::
                      __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                      operator*(&local_168);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8 + 3,local_158);
          *local_178 = *local_178 / *pvVar8;
          __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator++(&local_168);
        }
      }
    }
  }
  if (*(int *)(local_20 + 0xb4) == 0) {
    local_198 = local_38 * SQRT(local_38);
    local_1a0 = local_8 + 1;
    local_1a8._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffc58);
    local_1b0 = (double *)
                std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffc58);
    while (bVar14 = __gnu_cxx::operator!=
                              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_fffffffffffffc60,
                               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_fffffffffffffc58), bVar14) {
      local_1b8 = __gnu_cxx::
                  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                  operator*(&local_1a8);
      *local_1b8 = *local_1b8 / local_198;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_1a8);
    }
    local_1c0 = local_8 + 3;
    local_1c8._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffc58);
    local_1d0 = (double *)
                std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffc58);
    while (bVar14 = __gnu_cxx::operator!=
                              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_fffffffffffffc60,
                               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_fffffffffffffc58), bVar14) {
      local_1d8 = __gnu_cxx::
                  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                  operator*(&local_1c8);
      *local_1d8 = *local_1d8 / local_198;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_1c8);
    }
  }
  else if (*(int *)(local_20 + 0xb4) == 0x52) {
    local_1e0 = local_8 + 1;
    local_1e8._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffc58);
    local_1f0 = (double *)
                std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffc58);
    while (bVar14 = __gnu_cxx::operator!=
                              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_fffffffffffffc60,
                               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_fffffffffffffc58), bVar14) {
      local_1f8 = __gnu_cxx::
                  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                  operator*(&local_1e8);
      *local_1f8 = *local_1f8 / local_38;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_1e8);
    }
    local_200 = local_8 + 3;
    local_208._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffc58);
    local_210 = (double *)
                std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffc58);
    while (bVar14 = __gnu_cxx::operator!=
                              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_fffffffffffffc60,
                               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_fffffffffffffc58), bVar14) {
      local_218 = __gnu_cxx::
                  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                  operator*(&local_208);
      *local_218 = *local_218 / local_38;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_208);
    }
  }
  local_30 = local_30 + 1;
  auVar21._8_4_ = (int)((ulong)local_30 >> 0x20);
  auVar21._0_8_ = local_30;
  auVar21._12_4_ = 0x45300000;
  local_220 = (auVar21._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_30) - 4503599627370496.0);
  if (*(int *)(local_20 + 0xb0) == 0) {
    local_268 = local_8 + 1;
    local_270._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffc58);
    local_278 = (double *)
                std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffc58);
    while (bVar14 = __gnu_cxx::operator!=
                              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_fffffffffffffc60,
                               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_fffffffffffffc58), bVar14) {
      local_280 = __gnu_cxx::
                  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                  operator*(&local_270);
      *local_280 = local_220 * *local_280;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_270);
    }
    local_288 = local_8 + 3;
    local_290._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffc58);
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffc58);
    while (bVar14 = __gnu_cxx::operator!=
                              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_fffffffffffffc60,
                               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_fffffffffffffc58), bVar14) {
      pdVar13 = __gnu_cxx::
                __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                operator*(&local_290);
      *pdVar13 = local_220 * *pdVar13;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_290);
    }
  }
  else if (*(int *)(local_20 + 0xb0) == 0x47) {
    local_228 = local_8 + 1;
    local_230._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffc58);
    local_238 = (double *)
                std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffc58);
    while (bVar14 = __gnu_cxx::operator!=
                              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_fffffffffffffc60,
                               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_fffffffffffffc58), bVar14) {
      local_240 = __gnu_cxx::
                  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                  operator*(&local_230);
      *local_240 = *local_240 / local_220;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_230);
    }
    local_248 = local_8 + 3;
    local_250._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffc58);
    local_258 = (double *)
                std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffc58);
    while (bVar14 = __gnu_cxx::operator!=
                              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_fffffffffffffc60,
                               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_fffffffffffffc58), bVar14) {
      local_260 = __gnu_cxx::
                  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                  operator*(&local_250);
      *local_260 = *local_260 / local_220;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_250);
    }
  }
  if ((*(int *)(local_20 + 0xb4) != 0x51) || (*(int *)(local_20 + 0xb0) != 0x48)) {
    for (local_2a8 = 0; local_2a8 < (ulong)local_18[1]; local_2a8 = local_2a8 + 1) {
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8 + 1,local_2a8);
      vVar25 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8,local_2a8);
      *pvVar8 = vVar25 * *pvVar8;
    }
    for (local_2b0 = 0; local_2b0 < (ulong)local_18[5]; local_2b0 = local_2b0 + 1) {
      for (local_2b4 = 0; local_2b4 < *(int *)(local_18[3] + local_2b0 * 4);
          local_2b4 = local_2b4 + 1) {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_8 + 3,local_2b0);
        vVar25 = *pvVar8;
        pvVar9 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(local_8 + 2),local_2b0);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar9,(long)local_2b4);
        *pvVar8 = vVar25 * *pvVar8;
      }
    }
  }
  return;
}

Assistant:

void build_impute_node(ImputeNode &imputer,    WorkerMemory &workspace,
                       InputData  &input_data, ModelParams  &model_params,
                       std::vector<ImputeNode> &imputer_tree,
                       size_t curr_depth, size_t min_imp_obs)
{
    double wsum;
    bool has_weights = workspace.weights_arr.size() || workspace.weights_map.size();
    if (!has_weights)
        wsum = (double)(workspace.end - workspace.st + 1);
    else
        wsum = calculate_sum_weights<ldouble_safe>(
                                     workspace.ix_arr, workspace.st, workspace.end, curr_depth,
                                     workspace.weights_arr, workspace.weights_map);

    imputer.num_sum.resize(input_data.ncols_numeric, 0);
    imputer.num_weight.resize(input_data.ncols_numeric, 0);
    imputer.cat_sum.resize(input_data.ncols_categ);
    imputer.cat_weight.resize(input_data.ncols_categ, 0);
    imputer.num_sum.shrink_to_fit();
    imputer.num_weight.shrink_to_fit();
    imputer.cat_sum.shrink_to_fit();
    imputer.cat_weight.shrink_to_fit();

    /* Note: in theory, 'num_weight' could be initialized to 'wsum',
       and the entries could get subtracted the weight afterwards, but due to rounding
       error, this could produce some cases of no-present observations having positive
       weight, or cases of negative weight, so it's better to add it for each row after
       checking for possible NAs, even though it's less computationally efficient.
       For sparse matrices it's done the other way as otherwise it would be too slow. */

    for (size_t col = 0; col < input_data.ncols_categ; col++)
    {
        imputer.cat_sum[col].resize(input_data.ncat[col]);
        imputer.cat_sum[col].shrink_to_fit();
    }

    double  xnum;
    int     xcat;
    double  weight;
    size_t  ix;

    if ((input_data.Xc_indptr == NULL && input_data.ncols_numeric) || input_data.ncols_categ)
    {
        if (!has_weights)
        {
            size_t cnt;
            if (input_data.numeric_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            cnt++;
                            imputer.num_sum[col] += (xnum - imputer.num_sum[col]) / (ldouble_safe)cnt;
                        }
                    }
                    imputer.num_weight[col] = (double) cnt;
                }
            }

            if (input_data.categ_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_categ; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xcat = input_data.categ_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            cnt++;
                            imputer.cat_sum[col][xcat]++; /* later gets divided */
                        }
                    }
                    imputer.cat_weight[col] = (double) cnt;
                }
            }

        }

        else
        {
            ldouble_safe prod_sum, corr, val, diff;
            if (input_data.numeric_data != NULL)
            {
                 for (size_t col = 0; col < input_data.ncols_numeric; col++)
                 {
                    prod_sum = 0; corr = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            if (workspace.weights_arr.size())
                                weight = workspace.weights_arr[workspace.ix_arr[row]];
                            else
                                weight = workspace.weights_map[workspace.ix_arr[row]];

                            imputer.num_weight[col] += weight; /* these are always <= 1 */
                            val      =  (xnum * weight) - corr;
                            diff     =  prod_sum + val;
                            corr     =  (diff - prod_sum) - val;
                            prod_sum =  diff;
                        }
                    }
                    imputer.num_sum[col] = prod_sum / imputer.num_weight[col];
                 }
            }


            if (input_data.ncols_categ)
            {
                for (size_t row = workspace.st; row <= workspace.end; row++)
                {
                    ix = workspace.ix_arr[row];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[ix];
                    else
                        weight = workspace.weights_map[ix];

                    for (size_t col = 0; col < input_data.ncols_categ; col++)
                    {
                        xcat = input_data.categ_data[ix + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            imputer.cat_sum[col][xcat] += weight; /* later gets divided */
                            imputer.cat_weight[col]    += weight;
                        }
                    }
                }
            }
        }
    }

    if (input_data.Xc_indptr != NULL) /* sparse numeric */
    {
        size_t *ix_arr = workspace.ix_arr.data();
        size_t st_col, end_col, ind_end_col, curr_pos;
        std::fill(imputer.num_weight.begin(), imputer.num_weight.end(), wsum);

        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            st_col      =  input_data.Xc_indptr[col];
            end_col     =  input_data.Xc_indptr[col + 1] - 1;
            ind_end_col =  input_data.Xc_ind[end_col];
            curr_pos    =  st_col;
            for (size_t *row = std::lower_bound(ix_arr + workspace.st, ix_arr + workspace.end + 1, input_data.Xc_ind[st_col]);
                 row != ix_arr + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (input_data.Xc_ind[curr_pos] == static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                {
                    xnum = input_data.Xc[curr_pos];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[*row];
                    else if (workspace.weights_map.size())
                        weight = workspace.weights_map[*row];
                    else
                        weight = 1;

                    if (!is_na_or_inf(xnum))
                    {
                        imputer.num_sum[col]    += weight * xnum;
                    }

                    else
                    {
                        imputer.num_weight[col] -= weight;
                    }

                    if (row == ix_arr + workspace.end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos, input_data.Xc_ind + end_col + 1, *(++row)) - input_data.Xc_ind;
                }

                else
                {
                    if (input_data.Xc_ind[curr_pos] > static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                        row = std::lower_bound(row + 1, ix_arr + workspace.end + 1, input_data.Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos + 1, input_data.Xc_ind + end_col + 1, *row) - input_data.Xc_ind;
                }
            }

            imputer.num_sum[col] /= imputer.num_weight[col];
        }
    }

    /* if any value is not possible to impute, look it up from the parent tree, but assign a lesser weight
       Note: in theory, the parent node should always have some imputation value for every variable, but due to
       numeric rounding errors, it might have a weight of zero, so in those cases it's looked up higher up the
       tree instead. */
    size_t look_aboves, curr_tree;
    double min_imp_obs_dbl = (double) min_imp_obs;
    if (imputer.num_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            if (imputer.num_weight[col] < min_imp_obs_dbl)
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (!is_na_or_inf(imputer_tree[curr_tree].num_sum[col]))
                    {
                        imputer.num_sum[col]     =  imputer_tree[curr_tree].num_sum[col] / imputer_tree[curr_tree].num_weight[col];
                        imputer.num_weight[col]  =  wsum / (double)(2 * look_aboves);
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        imputer.num_sum[col]    = NAN;
                        imputer.num_weight[col] = 0;
                        break;
                    }
                }
            }
        }
    }

    if (imputer.cat_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_categ; col++)
        {
            if (imputer.cat_weight[col] >= min_imp_obs_dbl)
            {
                for (double &cat : imputer.cat_sum[col])
                    cat /= imputer.cat_weight[col];
            }

            else
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (imputer_tree[curr_tree].cat_weight[col] > 0)
                    {
                        for (int cat = 0; cat < input_data.ncat[col]; cat++)
                        {
                            imputer.cat_sum[col][cat]
                                +=
                            (imputer_tree[curr_tree].cat_sum[col][cat] > 0)?
                                (imputer_tree[curr_tree].cat_sum[col][cat] / imputer_tree[curr_tree].cat_weight[col]) : 0.;
                            imputer.cat_weight[col]    =  wsum / (double)(2 * look_aboves);
                        }
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        break;
                    }
                }
                imputer.cat_weight[col] = std::accumulate(imputer.cat_sum[col].begin(),
                                                          imputer.cat_sum[col].end(),
                                                          (double) 0);
            }
        }
    }

    /* re-adjust the weights according to parameters
       (note that by this point, the weights are a sum) */
    switch(model_params.weigh_imp_rows)
    {
        case Inverse:
        {
            double wsum_div = wsum * std::sqrt(wsum);
            for (double &w : imputer.num_weight)
                w /= wsum_div;

            for (double &w : imputer.cat_weight)
                w /= wsum_div;
            break;
        }

        case Flat:
        {
            for (double &w : imputer.num_weight)
                w /= wsum;
            for (double &w : imputer.cat_weight)
                w /= wsum;
            break;
        }

        default: {}

        /* TODO: maybe divide by nrows for prop */
    }

    double curr_depth_dbl = (double) (curr_depth + 1);
    switch(model_params.depth_imp)
    {
        case Lower:
        {
            for (double &w : imputer.num_weight)
                w /= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w /= curr_depth_dbl;
            break;
        }

        case Higher:
        {
            for (double &w : imputer.num_weight)
                w *= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w *= curr_depth_dbl;
            break;
        }

        default: {}
    }

    /* now re-adjust sums */
    if (model_params.weigh_imp_rows != Prop || model_params.depth_imp != Same)
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            imputer.num_sum[col] *= imputer.num_weight[col];

        for (size_t col = 0; col < input_data.ncols_categ; col++)
            for (int cat = 0; cat < input_data.ncat[col]; cat++)
                imputer.cat_sum[col][cat] *= imputer.cat_weight[col];
    }
}